

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

bool __thiscall pbrt::Image::WritePNG(Image *this,string *name,ImageMetadata *metadata)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 uVar3;
  uchar uVar4;
  uint uVar5;
  uchar *image;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  Point2i p;
  ushort *puVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int nOutOfGamut;
  string ret;
  int local_94;
  uchar *local_90;
  float local_84;
  ulong local_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  long local_50;
  ulong local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_94 = 0;
  iVar2 = (int)(this->channelNames).nStored;
  if (this->format == U256) {
    if (iVar2 == 3) {
      uVar10 = lodepng_encode24_file
                         ((name->_M_dataplus)._M_p,(this->p8).ptr,
                          (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                          (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
    else {
      if (iVar2 != 1) {
        local_78._M_dataplus._M_p._0_4_ = iVar2;
        LogFatal<int>(Fatal,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                      ,0x569,"Unhandled channel count in WritePNG(): %d",(int *)&local_78);
      }
      uVar10 = lodepng_encode_file((name->_M_dataplus)._M_p,(this->p8).ptr,
                                   (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                                   (this->resolution).super_Tuple2<pbrt::Point2,_int>.y,LCT_GREY,8);
    }
  }
  else {
    if (iVar2 == 1) {
      uVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar6 = (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x * (long)(int)uVar10;
      image = (uchar *)operator_new__(uVar6);
      memset(image,0,uVar6);
      if (0 < (long)(int)uVar10) {
        lVar8 = 0;
        local_80 = 0;
        local_90 = image;
        local_58 = name;
        do {
          if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
            uVar10 = (uint)local_80;
            lVar9 = 0;
            do {
              local_84 = (float)*(ushort *)
                                 (BlueNoiseTextures +
                                 (ulong)(uVar10 & 0x7f) * 2 + (ulong)(((uint)lVar9 & 0x7f) << 8)) /
                         65535.0 + -0.5;
              auVar13._0_4_ = GetChannel(this,(Point2i)(lVar8 + lVar9),0,(WrapMode2D)0x200000002);
              auVar13._4_60_ = extraout_var_00;
              if ((auVar13._0_4_ < 0.0) || (1.0 < auVar13._0_4_)) {
                local_94 = local_94 + 1;
              }
              if (auVar13._0_4_ <= 0.0) {
                uVar4 = '\0';
              }
              else {
                uVar4 = 0xff;
                if (auVar13._0_4_ < 1.0) {
                  uVar7 = (uint)(auVar13._0_4_ * 256.0);
                  if ((int)uVar7 < 0) {
                    auVar15._0_12_ = ZEXT812(0);
                    auVar15._12_4_ = 0;
                  }
                  else {
                    auVar15 = SUB6416(ZEXT464(0x3f800000),0);
                    if ((int)uVar7 < 0x100) {
                      auVar15 = vfmadd213ss_fma(ZEXT416(*(uint *)(LinearToSRGBPiecewise +
                                                                 (ulong)uVar7 * 8 + 4)),
                                                auVar13._0_16_,
                                                ZEXT416(*(uint *)(LinearToSRGBPiecewise +
                                                                 (ulong)uVar7 * 8)));
                    }
                  }
                  auVar14 = vfmadd213ss_fma(auVar15,SUB6416(ZEXT464(0x437f0000),0),
                                            ZEXT416((uint)local_84));
                  auVar15 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar14);
                  uVar3 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x40,1);
                  uVar4 = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar15._0_4_);
                }
              }
              local_90[lVar9 + (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x *
                               (long)(int)uVar10] = uVar4;
              lVar9 = lVar9 + 1;
            } while (lVar9 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
          }
          local_80 = local_80 + 1;
          uVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          lVar8 = lVar8 + 0x100000000;
          name = local_58;
          image = local_90;
        } while ((long)local_80 < (long)(int)uVar10);
      }
      uVar10 = lodepng_encode_file((name->_M_dataplus)._M_p,image,
                                   (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,uVar10,
                                   LCT_GREY,8);
    }
    else {
      uVar10 = 0;
      if (iVar2 != 3) goto LAB_0029dd16;
      uVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar6 = (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x * (long)(int)uVar10 * 3;
      local_58 = name;
      image = (uchar *)operator_new__(uVar6);
      uVar7 = 0;
      memset(image,0,uVar6);
      if (0 < (long)(int)uVar10) {
        local_50 = 0;
        local_90 = image;
        do {
          if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
            local_40 = BlueNoiseTextures + (uVar7 & 0x7f) * 2;
            local_48 = local_50 << 0x20;
            uVar10 = 0;
            uVar6 = 0;
            do {
              puVar11 = (ushort *)(local_40 + ((uVar10 & 0x7f) << 8));
              p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_48 | uVar6);
              lVar8 = 0;
              local_80 = uVar6;
              do {
                local_84 = (float)*puVar11 / 65535.0 + -0.5;
                auVar12._0_4_ = GetChannel(this,p,(int)lVar8,(WrapMode2D)0x200000002);
                auVar12._4_60_ = extraout_var;
                if ((auVar12._0_4_ < 0.0) || (1.0 < auVar12._0_4_)) {
                  local_94 = local_94 + 1;
                }
                if (auVar12._0_4_ <= 0.0) {
                  uVar4 = '\0';
                }
                else {
                  uVar4 = 0xff;
                  if (auVar12._0_4_ < 1.0) {
                    uVar5 = (uint)(auVar12._0_4_ * 256.0);
                    if ((int)uVar5 < 0) {
                      auVar14._0_12_ = ZEXT812(0);
                      auVar14._12_4_ = 0;
                    }
                    else {
                      auVar14 = SUB6416(ZEXT464(0x3f800000),0);
                      if ((int)uVar5 < 0x100) {
                        auVar14 = vfmadd213ss_fma(ZEXT416(*(uint *)(LinearToSRGBPiecewise +
                                                                   (ulong)uVar5 * 8 + 4)),
                                                  auVar12._0_16_,
                                                  ZEXT416(*(uint *)(LinearToSRGBPiecewise +
                                                                   (ulong)uVar5 * 8)));
                      }
                    }
                    auVar14 = vfmadd213ss_fma(auVar14,SUB6416(ZEXT464(0x437f0000),0),
                                              ZEXT416((uint)local_84));
                    auVar15 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar14);
                    uVar3 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x40,1);
                    uVar4 = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar15._0_4_);
                  }
                }
                local_90[lVar8 + (long)(int)((this->resolution).super_Tuple2<pbrt::Point2,_int>.x *
                                             uVar7 + uVar10) * 3] = uVar4;
                lVar8 = lVar8 + 1;
                puVar11 = puVar11 + 0x4000;
              } while (lVar8 != 3);
              uVar6 = local_80 + 1;
              uVar10 = uVar10 + 1;
            } while ((long)uVar6 < (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
          }
          local_50 = local_50 + 1;
          uVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          uVar7 = uVar7 + 1;
          image = local_90;
        } while (local_50 < (int)uVar10);
      }
      name = local_58;
      uVar10 = lodepng_encode24_file
                         ((local_58->_M_dataplus)._M_p,image,
                          (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,uVar10);
    }
    operator_delete__(image);
  }
LAB_0029dd16:
  paVar1 = &local_78.field_2;
  if (0 < local_94) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,int&>
              (&local_78,"%s: %d out of gamut pixel channels clamped to [0,1].",name,&local_94);
    Warning((FileLoc *)0x0,local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
  }
  if (uVar10 != 0) {
    local_38 = lodepng_error_text(uVar10);
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,char_const*>
              (&local_78,"Error writing PNG \"%s\": %s",name,&local_38);
    Error((FileLoc *)0x0,local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
  }
  return uVar10 == 0;
}

Assistant:

bool Image::WritePNG(const std::string &name, const ImageMetadata &metadata) const {
    unsigned int error = 0;
    int nOutOfGamut = 0;

    if (format == PixelFormat::U256) {
        if (NChannels() == 1)
            error = lodepng_encode_file(name.c_str(), p8.data(), resolution.x,
                                        resolution.y, LCT_GREY, 8 /* bitdepth */);
        else if (NChannels() == 3)
            // TODO: it would be nice to store the color encoding used in the
            // PNG metadata...
            error = lodepng_encode24_file(name.c_str(), p8.data(), resolution.x,
                                          resolution.y);
        else
            LOG_FATAL("Unhandled channel count in WritePNG(): %d", NChannels());
    } else if (NChannels() == 3) {
        // It may not actually be RGB, but that's what PNG's going to
        // assume..
        std::unique_ptr<uint8_t[]> rgb8 =
            std::make_unique<uint8_t[]>(3 * resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x)
                for (int c = 0; c < 3; ++c) {
                    Float dither = -.5f + BlueNoise(c, x, y);
                    Float v = GetChannel({x, y}, c);
                    if (v < 0 || v > 1)
                        ++nOutOfGamut;
                    rgb8[3 * (y * resolution.x + x) + c] = LinearToSRGB8(v, dither);
                }

        error =
            lodepng_encode24_file(name.c_str(), rgb8.get(), resolution.x, resolution.y);
    } else if (NChannels() == 1) {
        std::unique_ptr<uint8_t[]> y8 =
            std::make_unique<uint8_t[]>(resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x) {
                Float dither = -.5f + BlueNoise(0, x, y);
                Float v = GetChannel({x, y}, 0);
                if (v < 0 || v > 1)
                    ++nOutOfGamut;
                y8[y * resolution.x + x] = LinearToSRGB8(v, dither);
            }

        error = lodepng_encode_file(name.c_str(), y8.get(), resolution.x, resolution.y,
                                    LCT_GREY, 8 /* bitdepth */);
    }

    if (nOutOfGamut > 0)
        Warning("%s: %d out of gamut pixel channels clamped to [0,1].", name,
                nOutOfGamut);

    if (error != 0) {
        Error("Error writing PNG \"%s\": %s", name, lodepng_error_text(error));
        return false;
    }
    return true;
}